

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ulong in_RAX;
  sas_client *client;
  rxc_sink *sink;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  undefined8 in_R9;
  int option_index;
  
  iVar2 = 0;
  do {
    in_RAX = in_RAX & 0xffffffff;
    iVar1 = getopt_long(argc,argv,"h",long_options,&stack0xffffffffffffffcc,in_R9,in_RAX);
    if (iVar1 < 0) {
      iVar4 = 3;
      if (iVar1 != -1) {
LAB_00101b6f:
        abort();
      }
    }
    else if (iVar1 == 0) {
      iVar4 = 0;
    }
    else if (iVar1 == 0x3f) {
      main_cold_1();
      iVar4 = 1;
      iVar2 = 1;
    }
    else {
      if (iVar1 != 0x68) goto LAB_00101b6f;
      main_cold_2();
      iVar2 = 0;
      iVar4 = 1;
    }
  } while (iVar4 == 0);
  if (iVar4 == 1) {
    return iVar2;
  }
  if (argc < 3) {
    main_cold_3();
    return 1;
  }
  client = sas_client_alloc();
  if (client == (sas_client *)0x0) {
    sas_log("[ERROR] Failed to allocate server\n");
    return 1;
  }
  sink = sas_drivers_ignore();
  iVar2 = sas_client_init(client,sink);
  if (iVar2 == 0) {
    pcVar3 = argv[1];
    iVar2 = sas_client_connect_hostname(client,pcVar3,0xd80);
    if (iVar2 != 0) {
      pcVar3 = argv[1];
      pcVar5 = gai_strerror(iVar2);
      sas_log("[ERROR] Failed to connect to address %s: %s\n",pcVar3,pcVar5);
      goto LAB_00101af0;
    }
    sas_log("[INFO] Connected to address %s:%d\n",pcVar3,0xd80);
    sas_log("[INFO] Requesting %s\n",argv[2]);
    iVar2 = sas_client_receive(client,argv[2]);
    if (iVar2 == 0) {
      sas_client_dealloc(client);
      return 0;
    }
    pcVar3 = strerror(iVar2);
    pcVar5 = "[ERROR] Failed to receive: %s\n";
  }
  else {
    pcVar3 = strerror(iVar2);
    pcVar5 = "[ERROR] Failed to initialize client: %s\n";
  }
  sas_log(pcVar5,pcVar3);
LAB_00101af0:
  sas_client_dealloc(client);
  return 1;
}

Assistant:

int main(int argc, char **argv)
{
    /* Parse command line options */
    while (1) {
        int option_index = 0;
        int c = getopt_long(argc, argv, "h", long_options, &option_index);

        if (c == -1) {
            break;
        }

        switch (c) {
            case 0:
                if (long_options[option_index].flag != 0)
                    break;
                break;
            case 'h':
                print_usage(argv[0]);
                return EXIT_SUCCESS;
            case '?':
                print_usage(argv[0]);
                return EXIT_FAILURE;
            default:
                abort();
        }
    }

    if (argc <= 2) {
        print_usage(argv[0]);
        return EXIT_FAILURE;
    }

    int err;
    struct sas_client *client = sas_client_alloc();

    if (!client) {
        sas_log(LOG_ERR "Failed to allocate server\n");
        return EXIT_FAILURE;
    }

    if ((err = sas_client_init(client, sas_drivers_ignore())) != 0) {
        sas_log(LOG_ERR "Failed to initialize client: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    int port = 3456;
    char *addr = argv[1];

    if ((err = sas_client_connect_hostname(client, addr, port)) != 0) {
        sas_log(LOG_ERR "Failed to connect to address %s: %s\n", argv[1], gai_strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }

    sas_log(LOG_INFO "Connected to address %s:%d\n", addr, port);
    sas_log(LOG_INFO "Requesting %s\n", argv[2]);
    if ((err = sas_client_receive(client, argv[2])) != 0) {
        sas_log(LOG_ERR "Failed to receive: %s\n", strerror(err));
        sas_client_dealloc(client);
        return EXIT_FAILURE;
    }
    sas_client_dealloc(client);

    return EXIT_SUCCESS;
}